

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.h
# Opt level: O0

void NULLC::TraceLeave(double ts,uint eventPos,uint labelPos)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint *puVar4;
  double dVar5;
  TraceEvent *traceEvent;
  TraceEvent *enterEvent;
  uint currTs;
  TraceContext *context;
  uint labelPos_local;
  uint eventPos_local;
  double ts_local;
  
  lVar2 = traceContext;
  if (*(int *)(traceContext + 0x270) == *(int *)(traceContext + 0x274)) {
    TraceDump();
  }
  uVar3 = NULLCTime::clockMicro();
  if (eventPos < *(uint *)(lVar2 + 0x270)) {
    dVar5 = (double)*(uint *)(*(long *)(lVar2 + 0x278) + 4 + (ulong)eventPos * 8);
    if ((dVar5 == ts) && (!NAN(dVar5) && !NAN(ts))) {
      puVar4 = (uint *)(*(long *)(lVar2 + 0x278) + (ulong)eventPos * 8);
      if (*(uint *)(lVar2 + 0x260) < labelPos) {
        __assert_fail("context.labels.count >= labelPos",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/../NULLC/Trace.h"
                      ,0xfc,"void NULLC::TraceLeave(double, unsigned int, unsigned int)");
      }
      if ((*puVar4 & 1) == 0) {
        __assert_fail("enterEvent.isEnter",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/../NULLC/Trace.h"
                      ,0xfd,"void NULLC::TraceLeave(double, unsigned int, unsigned int)");
      }
      if (uVar3 - puVar4[1] < 0x32) {
        *(uint *)(lVar2 + 0x270) = eventPos;
        *(uint *)(lVar2 + 0x260) = labelPos;
        if (*(int *)(lVar2 + 0x244) != 0) {
          *(int *)(lVar2 + 0x244) = *(int *)(lVar2 + 0x244) + -1;
          return;
        }
        __assert_fail("context.depth != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/../NULLC/Trace.h"
                      ,0x104,"void NULLC::TraceLeave(double, unsigned int, unsigned int)");
      }
    }
  }
  uVar1 = *(uint *)(lVar2 + 0x270);
  *(uint *)(lVar2 + 0x270) = uVar1 + 1;
  puVar4 = (uint *)(*(long *)(lVar2 + 0x278) + (ulong)uVar1 * 8);
  *puVar4 = *puVar4 & 0xfffffffe;
  *puVar4 = *puVar4 & 0xfffffffd;
  *puVar4 = *puVar4 & 3;
  puVar4[1] = uVar3;
  if (*(int *)(lVar2 + 0x244) != 0) {
    *(int *)(lVar2 + 0x244) = *(int *)(lVar2 + 0x244) + -1;
    return;
  }
  __assert_fail("context.depth != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/../NULLC/Trace.h"
                ,0x112,"void NULLC::TraceLeave(double, unsigned int, unsigned int)");
}

Assistant:

inline void TraceLeave(double ts, unsigned eventPos, unsigned labelPos)
	{
		TraceContext &context = *traceContext;

		if(context.events.count == context.events.max)
			TraceDump();

		unsigned currTs = NULLCTime::clockMicro();

		if(context.events.count > eventPos && context.events.data[eventPos].ts == ts)
		{
			TraceEvent &enterEvent = context.events.data[eventPos];

			assert(context.labels.count >= labelPos);
			assert(enterEvent.isEnter);

			if(currTs - enterEvent.ts < 50)
			{
				context.events.count = eventPos;
				context.labels.count = labelPos;

				assert(context.depth != 0);
				context.depth--;

				return;
			}
		}

		TraceEvent &traceEvent = context.events.data[context.events.count++];

		traceEvent.isEnter = false;
		traceEvent.isLabel = false;
		traceEvent.token = 0;
		traceEvent.ts = currTs;

		assert(context.depth != 0);
		context.depth--;
	}